

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O0

void __thiscall duckdb::PatasScanState<float>::SkipGroup(PatasScanState<float> *this)

{
  unsigned_long uVar1;
  long in_RDI;
  idx_t group_size;
  
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -4;
  uVar1 = MinValue<unsigned_long>(0x400,*(long *)(in_RDI + 0x1c58) - *(long *)(in_RDI + 0x30));
  *(unsigned_long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + uVar1 * -2;
  *(unsigned_long *)(in_RDI + 0x30) = uVar1 + *(long *)(in_RDI + 0x30);
  return;
}

Assistant:

void SkipGroup() {
		// Skip the offset indicating where the data starts
		metadata_ptr -= sizeof(uint32_t);
		idx_t group_size = MinValue((idx_t)PatasPrimitives::PATAS_GROUP_SIZE, count - total_value_count);
		// Skip the blocks of packed data
		metadata_ptr -= sizeof(uint16_t) * group_size;

		total_value_count += group_size;
	}